

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_follow(Curl_easy *data,char *newurl,followtype type)

{
  int *piVar1;
  undefined1 *puVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  curl_trc_feat *pcVar8;
  byte bVar9;
  bool bVar10;
  CURLUcode CVar11;
  CURLcode CVar12;
  CURLU *pCVar13;
  size_t sVar14;
  char *pcVar15;
  Curl_handler *pCVar16;
  uint uVar17;
  undefined8 uVar18;
  followtype fVar19;
  CURLU **ppCVar20;
  bool bVar21;
  char *follow_url;
  undefined4 local_48;
  undefined4 local_44;
  char *scheme;
  char *referer;
  
  follow_url = (char *)0x0;
  fVar19 = FOLLOW_FAKE;
  if (type == FOLLOW_FAKE) {
LAB_001335c9:
    local_44 = 0;
    type = fVar19;
LAB_00133734:
    iVar4 = (data->req).httpcode;
    local_48 = 0;
    if ((iVar4 != 0x191) && (iVar4 != 0x197)) {
      uVar18 = 0;
      sVar14 = Curl_is_absolute_url(newurl,(char *)0x0,0,false);
      local_48 = (undefined4)CONCAT71((int7)((ulong)uVar18 >> 8),sVar14 != 0);
    }
    pCVar13 = (data->state).uh;
    if (type != FOLLOW_FAKE) {
      uVar17 = 0x800;
      if (type == FOLLOW_REDIR) {
        uVar17 = 0x880;
      }
      goto LAB_00133788;
    }
    uVar17 = 8;
    bVar21 = true;
    bVar10 = false;
  }
  else {
    piVar1 = &(data->state).requests;
    *piVar1 = *piVar1 + 1;
    if (type != FOLLOW_RETRY) {
      if (type == FOLLOW_REDIR) {
        lVar6 = (data->set).maxredirs;
        lVar7 = (data->state).followlocation;
        local_44 = (undefined4)CONCAT71((int7)((ulong)newurl >> 8),1);
        type = fVar19;
        if (lVar7 < lVar6 || lVar6 == -1) {
          (data->state).followlocation = lVar7 + 1;
          fVar19 = FOLLOW_REDIR;
          if (((data->set).field_0x89f & 0x10) != 0) {
            referer = (char *)0x0;
            if (((data->state).field_0x7c0 & 2) != 0) {
              (*Curl_cfree)((data->state).referer);
              (data->state).referer = (char *)0x0;
              puVar2 = &(data->state).field_0x7c0;
              *puVar2 = *puVar2 & 0xfd;
            }
            pCVar13 = curl_url();
            if (pCVar13 == (CURLU *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            bVar21 = false;
            CVar11 = curl_url_set(pCVar13,CURLUPART_URL,(data->state).url,0);
            if (CVar11 == CURLUE_OK) {
              bVar21 = false;
              CVar11 = curl_url_set(pCVar13,CURLUPART_FRAGMENT,(char *)0x0,0);
              if (CVar11 == CURLUE_OK) {
                bVar21 = false;
                CVar11 = curl_url_set(pCVar13,CURLUPART_USER,(char *)0x0,0);
                if (CVar11 == CURLUE_OK) {
                  bVar21 = false;
                  CVar11 = curl_url_set(pCVar13,CURLUPART_PASSWORD,(char *)0x0,0);
                  if (CVar11 == CURLUE_OK) {
                    CVar11 = curl_url_get(pCVar13,CURLUPART_URL,&referer,0);
                    bVar21 = CVar11 == CURLUE_OK;
                  }
                }
              }
            }
            curl_url_cleanup(pCVar13);
            if (!(bool)(referer != (char *)0x0 & bVar21)) {
              return CURLE_OUT_OF_MEMORY;
            }
            (data->state).referer = referer;
            puVar2 = &(data->state).field_0x7c0;
            *puVar2 = *puVar2 | 2;
          }
          goto LAB_001335c9;
        }
      }
      else {
        local_44 = 0;
      }
      goto LAB_00133734;
    }
    pCVar13 = (data->state).uh;
    uVar17 = 0x800;
    local_44 = 0;
    local_48 = 0;
LAB_00133788:
    uVar17 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x89c >> 0x27) & 0x10 | uVar17;
    bVar10 = true;
    bVar21 = false;
  }
  ppCVar20 = &(data->state).uh;
  CVar11 = curl_url_set(pCVar13,CURLUPART_URL,newurl,uVar17);
  if (CVar11 != CURLUE_OK) {
    if (!bVar21) {
      pcVar15 = curl_url_strerror(CVar11);
      Curl_failf(data,"The redirect target URL could not be parsed: %s",pcVar15);
      goto LAB_00133815;
    }
    follow_url = (*Curl_cstrdup)(newurl);
    if (follow_url == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    goto LAB_00133991;
  }
  CVar11 = curl_url_get(*ppCVar20,CURLUPART_URL,&follow_url,0);
  if (CVar11 != CURLUE_OK) goto LAB_00133815;
  if (bVar10 && ((data->set).field_0x89f & 2) == 0) {
    uVar3 = (data->set).use_port;
    uVar17 = (uint)uVar3;
    if ((uVar3 == 0) || (((data->state).field_0x7be & 0x40) == 0)) {
      CVar11 = curl_url_get(*ppCVar20,CURLUPART_PORT,&referer,1);
      pcVar15 = referer;
      if (CVar11 == CURLUE_OK) {
        uVar17 = atoi(referer);
        (*Curl_cfree)(pcVar15);
        goto LAB_0013387c;
      }
LAB_0013389c:
      (*Curl_cfree)(follow_url);
LAB_00133815:
      CVar12 = Curl_uc_to_curlcode(CVar11);
      return CVar12;
    }
LAB_0013387c:
    uVar5 = (data->info).conn_remote_port;
    if (uVar17 == uVar5) {
      CVar11 = curl_url_get(*ppCVar20,CURLUPART_SCHEME,&scheme,0);
      if (CVar11 != CURLUE_OK) goto LAB_0013389c;
      pCVar16 = Curl_get_scheme_handler(scheme);
      if ((pCVar16 == (Curl_handler *)0x0) || (pCVar16->protocol == (data->info).conn_protocol)) {
        (*Curl_cfree)(scheme);
        goto LAB_00133987;
      }
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))))
      {
        Curl_infof(data,"Clear auth, redirects scheme from %s to %s",(data->info).conn_scheme,scheme
                  );
      }
      (*Curl_cfree)(scheme);
    }
    else if ((((data->set).field_0x89f & 0x40) != 0) &&
            ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level)
             ))) {
      Curl_infof(data,"Clear auth, redirects to port from %u to %u",(ulong)uVar5,(ulong)uVar17);
    }
    (*Curl_cfree)((data->state).aptr.user);
    (data->state).aptr.user = (char *)0x0;
    (*Curl_cfree)((data->state).aptr.passwd);
    (data->state).aptr.passwd = (char *)0x0;
  }
LAB_00133987:
  if (bVar21) {
LAB_00133991:
    (data->info).wouldredirect = follow_url;
    CVar12 = CURLE_OK;
    if ((char)local_44 != '\0') {
      Curl_failf(data,"Maximum (%ld) redirects followed",(data->set).maxredirs);
      CVar12 = CURLE_TOO_MANY_REDIRECTS;
    }
    return CVar12;
  }
  uVar17 = *(uint *)&(data->state).field_0x7be;
  if ((char)local_48 != '\0') {
    uVar17 = uVar17 & 0xffffffbf;
    *(uint *)&(data->state).field_0x7be = uVar17;
  }
  if ((uVar17 >> 0x10 & 1) != 0) {
    (*Curl_cfree)((data->state).url);
    uVar17 = *(uint *)&(data->state).field_0x7be;
  }
  (data->state).url = follow_url;
  *(uint *)&(data->state).field_0x7be = uVar17 | 0x10000;
  Curl_req_soft_reset(&data->req,data);
  if ((((data->set).field_0x89f & 0x40) != 0) &&
     ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level)))) {
    Curl_infof(data,"Issue another request to this URL: \'%s\'",(data->state).url);
  }
  if ((((((data->set).http_follow_mode == '\x03') && ((data->set).str[0x1c] != (char *)0x0)) &&
       (uVar17 = *(uint *)&(data->state).field_0x7be, (uVar17 >> 0x15 & 1) == 0)) &&
      (*(uint *)&(data->state).field_0x7be = uVar17 | 0x200000,
      ((data->set).field_0x89f & 0x40) != 0)) &&
     ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level)))) {
    Curl_infof(data,"Drop custom request method for next request");
  }
  iVar4 = (data->info).httpcode;
  if (iVar4 == 0x12f) {
    bVar9 = (data->state).httpreq;
    if (bVar9 - 1 < 3) {
      bVar9 = (data->set).keep_post & 4;
      goto joined_r0x00133af4;
    }
    if (bVar9 == 0) goto LAB_00133b18;
  }
  else {
    if (iVar4 == 0x12e) {
      if (2 < (byte)((data->state).httpreq - 1)) goto LAB_00133b18;
      bVar9 = (data->set).keep_post & 2;
    }
    else {
      if ((iVar4 != 0x12d) || (2 < (byte)((data->state).httpreq - 1))) goto LAB_00133b18;
      bVar9 = (data->set).keep_post & 1;
    }
joined_r0x00133af4:
    if (bVar9 != 0) goto LAB_00133b18;
  }
  http_switch_to_get(data,iVar4);
LAB_00133b18:
  Curl_pgrsTime(data,TIMER_REDIRECT);
  Curl_pgrsResetTransferSizes(data);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_follow(struct Curl_easy *data, const char *newurl,
                          followtype type)
{
  bool disallowport = FALSE;
  bool reachedmax = FALSE;
  char *follow_url = NULL;
  CURLUcode uc;

  DEBUGASSERT(type != FOLLOW_NONE);

  if(type != FOLLOW_FAKE)
    data->state.requests++; /* count all real follows */
  if(type == FOLLOW_REDIR) {
    if((data->set.maxredirs != -1) &&
       (data->state.followlocation >= data->set.maxredirs)) {
      reachedmax = TRUE;
      type = FOLLOW_FAKE; /* switch to fake to store the would-be-redirected
                             to URL */
    }
    else {
      data->state.followlocation++; /* count redirect-followings, including
                                       auth reloads */

      if(data->set.http_auto_referer) {
        CURLU *u;
        char *referer = NULL;

        /* We are asked to automatically set the previous URL as the referer
           when we get the next URL. We pick the ->url field, which may or may
           not be 100% correct */

        if(data->state.referer_alloc) {
          Curl_safefree(data->state.referer);
          data->state.referer_alloc = FALSE;
        }

        /* Make a copy of the URL without credentials and fragment */
        u = curl_url();
        if(!u)
          return CURLE_OUT_OF_MEMORY;

        uc = curl_url_set(u, CURLUPART_URL, data->state.url, 0);
        if(!uc)
          uc = curl_url_set(u, CURLUPART_FRAGMENT, NULL, 0);
        if(!uc)
          uc = curl_url_set(u, CURLUPART_USER, NULL, 0);
        if(!uc)
          uc = curl_url_set(u, CURLUPART_PASSWORD, NULL, 0);
        if(!uc)
          uc = curl_url_get(u, CURLUPART_URL, &referer, 0);

        curl_url_cleanup(u);

        if(uc || !referer)
          return CURLE_OUT_OF_MEMORY;

        data->state.referer = referer;
        data->state.referer_alloc = TRUE; /* yes, free this later */
      }
    }
  }

  if((type != FOLLOW_RETRY) &&
     (data->req.httpcode != 401) && (data->req.httpcode != 407) &&
     Curl_is_absolute_url(newurl, NULL, 0, FALSE)) {
    /* If this is not redirect due to a 401 or 407 response and an absolute
       URL: do not allow a custom port number */
    disallowport = TRUE;
  }

  DEBUGASSERT(data->state.uh);
  uc = curl_url_set(data->state.uh, CURLUPART_URL, newurl, (unsigned int)
                    ((type == FOLLOW_FAKE) ? CURLU_NON_SUPPORT_SCHEME :
                     ((type == FOLLOW_REDIR) ? CURLU_URLENCODE : 0) |
                     CURLU_ALLOW_SPACE |
                     (data->set.path_as_is ? CURLU_PATH_AS_IS : 0)));
  if(uc) {
    if(type != FOLLOW_FAKE) {
      failf(data, "The redirect target URL could not be parsed: %s",
            curl_url_strerror(uc));
      return Curl_uc_to_curlcode(uc);
    }

    /* the URL could not be parsed for some reason, but since this is FAKE
       mode, just duplicate the field as-is */
    follow_url = strdup(newurl);
    if(!follow_url)
      return CURLE_OUT_OF_MEMORY;
  }
  else {
    uc = curl_url_get(data->state.uh, CURLUPART_URL, &follow_url, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);

    /* Clear auth if this redirects to a different port number or protocol,
       unless permitted */
    if(!data->set.allow_auth_to_other_hosts && (type != FOLLOW_FAKE)) {
      char *portnum;
      int port;
      bool clear = FALSE;

      if(data->set.use_port && data->state.allow_port)
        /* a custom port is used */
        port = (int)data->set.use_port;
      else {
        uc = curl_url_get(data->state.uh, CURLUPART_PORT, &portnum,
                          CURLU_DEFAULT_PORT);
        if(uc) {
          free(follow_url);
          return Curl_uc_to_curlcode(uc);
        }
        port = atoi(portnum);
        free(portnum);
      }
      if(port != data->info.conn_remote_port) {
        infof(data, "Clear auth, redirects to port from %u to %u",
              data->info.conn_remote_port, port);
        clear = TRUE;
      }
      else {
        char *scheme;
        const struct Curl_handler *p;
        uc = curl_url_get(data->state.uh, CURLUPART_SCHEME, &scheme, 0);
        if(uc) {
          free(follow_url);
          return Curl_uc_to_curlcode(uc);
        }

        p = Curl_get_scheme_handler(scheme);
        if(p && (p->protocol != data->info.conn_protocol)) {
          infof(data, "Clear auth, redirects scheme from %s to %s",
                data->info.conn_scheme, scheme);
          clear = TRUE;
        }
        free(scheme);
      }
      if(clear) {
        Curl_safefree(data->state.aptr.user);
        Curl_safefree(data->state.aptr.passwd);
      }
    }
  }
  DEBUGASSERT(follow_url);

  if(type == FOLLOW_FAKE) {
    /* we are only figuring out the new URL if we would have followed locations
       but now we are done so we can get out! */
    data->info.wouldredirect = follow_url;

    if(reachedmax) {
      failf(data, "Maximum (%ld) redirects followed", data->set.maxredirs);
      return CURLE_TOO_MANY_REDIRECTS;
    }
    return CURLE_OK;
  }

  if(disallowport)
    data->state.allow_port = FALSE;

  if(data->state.url_alloc)
    Curl_safefree(data->state.url);

  data->state.url = follow_url;
  data->state.url_alloc = TRUE;
  Curl_req_soft_reset(&data->req, data);
  infof(data, "Issue another request to this URL: '%s'", data->state.url);
  if((data->set.http_follow_mode == CURLFOLLOW_FIRSTONLY) &&
     data->set.str[STRING_CUSTOMREQUEST] &&
     !data->state.http_ignorecustom) {
    data->state.http_ignorecustom = TRUE;
    infof(data, "Drop custom request method for next request");
  }

  /*
   * We get here when the HTTP code is 300-399 (and 401). We need to perform
   * differently based on exactly what return code there was.
   *
   * News from 7.10.6: we can also get here on a 401 or 407, in case we act on
   * an HTTP (proxy-) authentication scheme other than Basic.
   */
  switch(data->info.httpcode) {
    /* 401 - Act on a WWW-Authenticate, we keep on moving and do the
       Authorization: XXXX header in the HTTP request code snippet */
    /* 407 - Act on a Proxy-Authenticate, we keep on moving and do the
       Proxy-Authorization: XXXX header in the HTTP request code snippet */
    /* 300 - Multiple Choices */
    /* 306 - Not used */
    /* 307 - Temporary Redirect */
  default:  /* for all above (and the unknown ones) */
    /* Some codes are explicitly mentioned since I have checked RFC2616 and
     * they seem to be OK to POST to.
     */
    break;
  case 301: /* Moved Permanently */
    /* (quote from RFC7231, section 6.4.2)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request. If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behavior is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->state.httpreq == HTTPREQ_POST
        || data->state.httpreq == HTTPREQ_POST_FORM
        || data->state.httpreq == HTTPREQ_POST_MIME)
       && !(data->set.keep_post & CURL_REDIR_POST_301))
      http_switch_to_get(data, 301);
    break;
  case 302: /* Found */
    /* (quote from RFC7231, section 6.4.3)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request. If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behavior is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->state.httpreq == HTTPREQ_POST
        || data->state.httpreq == HTTPREQ_POST_FORM
        || data->state.httpreq == HTTPREQ_POST_MIME)
       && !(data->set.keep_post & CURL_REDIR_POST_302))
      http_switch_to_get(data, 302);
    break;

  case 303: /* See Other */
    /* 'See Other' location is not the resource but a substitute for the
     * resource. In this case we switch the method to GET/HEAD, unless the
     * method is POST and the user specified to keep it as POST.
     * https://github.com/curl/curl/issues/5237#issuecomment-614641049
     */
    if(data->state.httpreq != HTTPREQ_GET &&
       ((data->state.httpreq != HTTPREQ_POST &&
         data->state.httpreq != HTTPREQ_POST_FORM &&
         data->state.httpreq != HTTPREQ_POST_MIME) ||
        !(data->set.keep_post & CURL_REDIR_POST_303)))
      http_switch_to_get(data, 303);
    break;
  case 304: /* Not Modified */
    /* 304 means we did a conditional request and it was "Not modified".
     * We should not get any Location: header in this response!
     */
    break;
  case 305: /* Use Proxy */
    /* (quote from RFC2616, section 10.3.6):
     * "The requested resource MUST be accessed through the proxy given
     * by the Location field. The Location field gives the URI of the
     * proxy. The recipient is expected to repeat this single request
     * via the proxy. 305 responses MUST only be generated by origin
     * servers."
     */
    break;
  }
  Curl_pgrsTime(data, TIMER_REDIRECT);
  Curl_pgrsResetTransferSizes(data);

  return CURLE_OK;
}